

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

int lua_setiuservalue(lua_State *L,int idx,int n)

{
  lua_CFunction p_Var1;
  long lVar2;
  TValue *pTVar3;
  long lVar4;
  int iVar5;
  
  pTVar3 = index2value(L,idx);
  p_Var1 = (pTVar3->value_).f;
  iVar5 = 0;
  if (n - 1U < (uint)*(ushort *)(p_Var1 + 10)) {
    lVar4 = (ulong)(n - 1U) * 0x10;
    lVar2 = (L->top).offset;
    *(undefined8 *)(p_Var1 + lVar4 + 0x28) = *(undefined8 *)(lVar2 + -0x10);
    p_Var1[lVar4 + 0x30] = (_func_int_lua_State_ptr)*(undefined1 *)(lVar2 + -8);
    iVar5 = 1;
    if ((((*(byte *)((L->top).offset + -8) & 0x40) != 0) &&
        ((((pTVar3->value_).gc)->marked & 0x20) != 0)) &&
       ((*(byte *)(*(long *)((L->top).offset + -0x10) + 9) & 0x18) != 0)) {
      luaC_barrierback_(L,(pTVar3->value_).gc);
    }
  }
  (L->top).p = (StkId)((L->top).offset + -0x10);
  return iVar5;
}

Assistant:

LUA_API int lua_setiuservalue (lua_State *L, int idx, int n) {
  TValue *o;
  int res;
  lua_lock(L);
  api_checknelems(L, 1);
  o = index2value(L, idx);
  api_check(L, ttisfulluserdata(o), "full userdata expected");
  if (!(cast_uint(n) - 1u < cast_uint(uvalue(o)->nuvalue)))
    res = 0;  /* 'n' not in [1, uvalue(o)->nuvalue] */
  else {
    setobj(L, &uvalue(o)->uv[n - 1].uv, s2v(L->top.p - 1));
    luaC_barrierback(L, gcvalue(o), s2v(L->top.p - 1));
    res = 1;
  }
  L->top.p--;
  lua_unlock(L);
  return res;
}